

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperationsExecuter.h
# Opt level: O2

bool __thiscall Refal2::COperationsExecuter::matchLeft_E(COperationsExecuter *this)

{
  bool bVar1;
  
  bVar1 = shiftLeft(this);
  if (bVar1) {
    if (((this->left->super_CUnit).type & UT_LeftParen) != 0) {
      this->left = (CUnitNode *)(this->left->super_CUnit).field_1;
    }
    saveState(this);
  }
  return bVar1;
}

Assistant:

inline bool COperationsExecuter::matchLeft_E()
{
	if( shiftLeft() ) {
		if( left->IsLeftParen() ) {
			left = left->PairedParen();
		}
		saveState();
		return true;
	} else {
		return false;
	}
}